

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::computeNgrams
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subngram,
          subentry *sublemma,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *submorph,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subipangram)

{
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  value_type *pvVar9;
  char *pcVar10;
  value_type *pvVar11;
  element_type *peVar12;
  long in_RDI;
  string *in_R8;
  subentry e_2;
  int32_t h_3;
  size_t n_1;
  size_t j_1;
  string charn_1;
  size_t i_2;
  string temp_word_1;
  subentry e_1;
  int32_t h_2;
  int32_t m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  morphValues;
  int32_t h_1;
  string val;
  subentry e;
  int32_t h;
  size_t n;
  size_t j;
  string charn;
  size_t i_1;
  string temp_word;
  bool useProp;
  string prop;
  string value;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsValues;
  string *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  uint32_t in_stack_fffffffffffffbe4;
  value_type *in_stack_fffffffffffffbe8;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  Dictionary *in_stack_fffffffffffffc00;
  value_type *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  string local_2c8 [32];
  long local_2a8;
  int local_2a0;
  uint local_29c;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *local_298;
  value_type *local_290;
  string local_288 [32];
  value_type *local_268;
  string local_260 [32];
  string local_240 [32];
  string local_220 [36];
  int local_1fc;
  string local_1f8 [32];
  long local_1d8;
  uint local_1d0;
  int local_1cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  int local_1b0;
  uint local_1ac;
  string local_1a8 [32];
  string local_188 [32];
  long local_168;
  int local_160;
  uint local_15c;
  ulong local_158;
  ulong local_150;
  undefined4 local_144;
  string local_140 [32];
  ulong local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  undefined1 local_a1;
  string local_a0 [48];
  string local_70 [32];
  ulong local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  string *local_28;
  
  local_28 = in_R8;
  utils::split((string *)in_stack_fffffffffffffc48,(char)((ulong)in_stack_fffffffffffffc40 >> 0x38))
  ;
  for (local_50 = 0; uVar8 = local_50,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_48), uVar8 < sVar4; local_50 = local_50 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_48,local_50);
    std::__cxx11::string::string(local_70,(string *)pvVar5);
    std::__cxx11::string::find((char)local_70,0x3a);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_70);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x145502);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbd8,(key_type *)0x145519);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x145540);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbd8);
    local_a1 = std::__detail::operator!=(&local_b0,&local_b8);
    if ((bool)local_a1) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              (char *)in_stack_fffffffffffffbd8);
      if (bVar2) {
        std::__cxx11::string::find((char)local_70,0x3a);
        std::__cxx11::string::substr((ulong)local_118,(ulong)local_70);
        std::operator+(&in_stack_fffffffffffffbe8->subword,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        std::operator+(&in_stack_fffffffffffffbe8->subword,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
        for (local_120 = 0; uVar8 = local_120, uVar6 = std::__cxx11::string::size(), uVar8 < uVar6;
            local_120 = local_120 + 1) {
          std::__cxx11::string::string(local_140);
          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_d8);
          if (((int)*pcVar10 & 0xc0U) == 0x80) {
            local_144 = 7;
          }
          else {
            local_150 = local_120;
            local_158 = 1;
            while( true ) {
              uVar6 = local_150;
              uVar7 = std::__cxx11::string::size();
              uVar8 = local_158;
              bVar2 = false;
              if (uVar6 < uVar7) {
                peVar12 = std::
                          __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1457f8);
                bVar2 = uVar8 <= (ulong)(long)peVar12->maxn;
              }
              if (!bVar2) break;
              local_150 = local_150 + 1;
              std::__cxx11::string::operator[]((ulong)local_d8);
              std::__cxx11::string::push_back((char)local_140);
              while( true ) {
                uVar8 = local_150;
                uVar6 = std::__cxx11::string::size();
                bVar2 = false;
                if (uVar8 < uVar6) {
                  pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_d8);
                  bVar2 = ((int)*pcVar10 & 0xc0U) == 0x80;
                }
                uVar8 = local_158;
                if (!bVar2) break;
                local_150 = local_150 + 1;
                std::__cxx11::string::operator[]((ulong)local_d8);
                std::__cxx11::string::push_back((char)local_140);
              }
              peVar12 = std::
                        __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x14595a);
              uVar6 = local_150;
              if (((ulong)(long)peVar12->minn <= uVar8) &&
                 ((local_158 != 1 ||
                  ((local_120 != 0 && (uVar8 = std::__cxx11::string::size(), uVar6 != uVar8)))))) {
                uVar3 = hash(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
                peVar12 = std::
                          __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1459e9);
                local_15c = uVar3 % (uint)peVar12->bucket;
                local_160 = *(int *)(in_RDI + 0x94) + local_15c;
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                           (value_type_conflict *)in_stack_fffffffffffffbd8);
                subentry::subentry((subentry *)0x145a4e);
                std::__cxx11::string::operator=(local_188,local_140);
                local_168 = (long)(int)(*(int *)(in_RDI + 0x94) + local_15c);
                std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                          (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                subentry::~subentry((subentry *)0x145aaa);
              }
              local_158 = local_158 + 1;
            }
            local_144 = 0;
          }
          std::__cxx11::string::~string(local_140);
        }
        std::__cxx11::string::~string(local_d8);
      }
      else {
        std::__cxx11::string::find((char)local_70,0x3a);
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_70);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                (char *)in_stack_fffffffffffffbd8);
        if (bVar2) {
          uVar3 = hash(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          peVar12 = std::
                    __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x145bfd);
          local_1ac = uVar3 % (uint)peVar12->bucket;
          *(long *)(local_28 + 0x20) = (long)(int)(*(int *)(in_RDI + 0x94) + local_1ac);
          std::__cxx11::string::operator=(local_28,local_70);
          local_1b0 = *(int *)(in_RDI + 0x94) + local_1ac;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (value_type_conflict *)in_stack_fffffffffffffbd8);
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                (char *)in_stack_fffffffffffffbd8);
        if (bVar2) {
          utils::split((string *)in_stack_fffffffffffffc48,
                       (char)((ulong)in_stack_fffffffffffffc40 >> 0x38));
          for (local_1cc = 0; uVar8 = (ulong)local_1cc,
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&local_1c8), uVar8 < sVar4; local_1cc = local_1cc + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_1c8,(long)local_1cc);
            uVar3 = hash(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            peVar12 = std::
                      __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x145d68);
            local_1d0 = uVar3 % (uint)peVar12->bucket;
            subentry::subentry((subentry *)0x145d95);
            local_1d8 = (long)(int)(*(int *)(in_RDI + 0x94) + local_1d0);
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_1c8,(long)local_1cc);
            std::__cxx11::string::operator=(local_1f8,(string *)pvVar5);
            std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                      (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            local_1fc = *(int *)(in_RDI + 0x94) + local_1d0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (value_type_conflict *)in_stack_fffffffffffffbd8);
            subentry::~subentry((subentry *)0x145e36);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbf0);
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                (char *)in_stack_fffffffffffffbd8);
        if (bVar2) {
          in_stack_fffffffffffffc48 = local_70;
          std::__cxx11::string::find((char)in_stack_fffffffffffffc48,0x3a);
          std::__cxx11::string::substr((ulong)local_260,(ulong)in_stack_fffffffffffffc48);
          std::operator+(&in_stack_fffffffffffffbe8->subword,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          std::operator+(&in_stack_fffffffffffffbe8->subword,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          std::__cxx11::string::~string(local_240);
          std::__cxx11::string::~string(local_260);
          local_268 = (value_type *)0x0;
          while (in_stack_fffffffffffffc40 = local_268,
                pvVar9 = (value_type *)std::__cxx11::string::size(),
                in_stack_fffffffffffffc40 < pvVar9) {
            std::__cxx11::string::string(local_288);
            pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_220);
            if (((int)*pcVar10 & 0xc0U) == 0x80) {
              local_144 = 0x12;
            }
            else {
              local_290 = local_268;
              local_298 = (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)0x1;
              while( true ) {
                pvVar9 = local_290;
                pvVar11 = (value_type *)std::__cxx11::string::size();
                pvVar1 = local_298;
                bVar2 = false;
                if (pvVar9 < pvVar11) {
                  peVar12 = std::
                            __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x14608e);
                  bVar2 = pvVar1 <= (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                                     *)(long)peVar12->maxn;
                }
                if (!bVar2) break;
                local_290 = (value_type *)&local_290->field_0x1;
                std::__cxx11::string::operator[]((ulong)local_220);
                std::__cxx11::string::push_back((char)local_288);
                while( true ) {
                  pvVar9 = local_290;
                  pvVar11 = (value_type *)std::__cxx11::string::size();
                  bVar2 = false;
                  if (pvVar9 < pvVar11) {
                    in_stack_fffffffffffffc00 =
                         (Dictionary *)std::__cxx11::string::operator[]((ulong)local_220);
                    bVar2 = ((int)*(char *)&(in_stack_fffffffffffffc00->args_).
                                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr & 0xc0U) == 0x80;
                  }
                  if (!bVar2) break;
                  local_290 = (value_type *)&local_290->field_0x1;
                  in_stack_fffffffffffffbf8 =
                       (string *)std::__cxx11::string::operator[]((ulong)local_220);
                  std::__cxx11::string::push_back((char)local_288);
                }
                in_stack_fffffffffffffbf0 = local_298;
                peVar12 = std::
                          __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1461c3);
                if (((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                     (long)peVar12->minn <= in_stack_fffffffffffffbf0) &&
                   ((local_298 !=
                     (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)0x1 ||
                    ((local_268 != (value_type *)0x0 &&
                     (in_stack_fffffffffffffbe8 = local_290,
                     pvVar9 = (value_type *)std::__cxx11::string::size(),
                     in_stack_fffffffffffffbe8 != pvVar9)))))) {
                  in_stack_fffffffffffffbe4 =
                       hash(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
                  peVar12 = std::
                            __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x146246);
                  local_29c = in_stack_fffffffffffffbe4 % (uint)peVar12->bucket;
                  local_2a0 = *(int *)(in_RDI + 0x94) + local_29c;
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (value_type_conflict *)in_stack_fffffffffffffbd8);
                  in_stack_fffffffffffffbd8 = local_2c8;
                  subentry::subentry((subentry *)0x1462a4);
                  std::__cxx11::string::operator=(in_stack_fffffffffffffbd8,local_288);
                  local_2a8 = (long)(int)(*(int *)(in_RDI + 0x94) + local_29c);
                  std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                  subentry::~subentry((subentry *)0x1462fc);
                }
                local_298 = (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                            ((long)&(local_298->
                                    super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1);
              }
              local_144 = 0;
            }
            std::__cxx11::string::~string(local_288);
            local_268 = (value_type *)&local_268->field_0x1;
          }
          std::__cxx11::string::~string(local_220);
        }
        std::__cxx11::string::~string(local_1a8);
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbf0);
  return;
}

Assistant:

void Dictionary::computeNgrams(const std::string& word,
                               std::vector<int32_t>& ngrams,
			      std::vector<subentry>& subngram,
	                      subentry& sublemma,
                              std::vector<subentry>& submorph,
			      std::vector<subentry>& subipangram) const {
  //char x;
  std::vector<std::string> propsValues = utils::split(word, '~');
  for (size_t i = 0; i < propsValues.size(); i++) {
    std::string value = propsValues[i];
	std::string prop = value.substr(0, value.find(PROP_VALUE_SEP));
  const bool useProp = args_->props.find(prop) != args_->props.end();
	if (useProp) {
	   if(prop == "w"){

        // If only whole word  uncomment next two lines and comment rest code in the if loop
		/*int32_t h = hash(value) % args_->bucket;
		ngrams.push_back(nwords_ + h);*/

       // Default consider character-ngrams
	   std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	   for (size_t i = 0; i < temp_word.size(); i++) {
            std::string charn;
            if ((temp_word[i] & 0xC0) == 0x80) continue;
            for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
              charn.push_back(temp_word[j++]);
              while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                charn.push_back(temp_word[j++]);
              }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subngram.push_back(e);
              }
            }
          }
	}
	else{
         std::string val = value.substr(value.find(PROP_VALUE_SEP)+1, std::string::npos);
         if(prop == "l"){
	  	    int32_t h = hash(value) % args_->bucket;
            sublemma.id = nwords_+h;
		    sublemma.subword = value;
	        ngrams.push_back(nwords_ + h);
	      }
	    if(prop == "m"){
            //Default encodes each morph tag separately
		    std::vector<std::string> morphValues = utils::split(val, '+');

		    for(int32_t m=0;m<morphValues.size();m++){
			    int32_t h = hash( morphValues[m]) % args_->bucket;
			    subentry e;
			    e.id = nwords_+h;
			    e.subword =  morphValues[m];
			    submorph.push_back(e);
	   		    ngrams.push_back(nwords_ + h);
		    }

          //Encodes the morphology tags as a whole
		  /*subentry e;
		  std::string val = value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos);
		  if(value=="")
		  { value = "m:<unk>";}
		  int32_t h = hash(value) % args_->bucket;
		  e.id = nwords_+h;
		  e.subword = value;
		  submorph.push_back(e);
		  ngrams.push_back(nwords_+h);*/
	    }

        if(prop == "ipa"){
	
	      std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	      for (size_t i = 0; i < temp_word.size(); i++) {
                std::string charn;
                if ((temp_word[i] & 0xC0) == 0x80) continue;
                for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
                    charn.push_back(temp_word[j++]);
                    while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                    charn.push_back(temp_word[j++]);
                 }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subipangram.push_back(e);
              }
            }
          }
	    }
	  }
	}
  }
}